

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void child_setup(double *child_cub,double x,double y,double z,double dist)

{
  int local_34;
  int i;
  double dist_local;
  double z_local;
  double y_local;
  double x_local;
  double *child_cub_local;
  
  *child_cub = x;
  child_cub[1] = y;
  child_cub[2] = z;
  child_cub[3] = x + dist;
  child_cub[4] = y;
  child_cub[5] = z;
  child_cub[6] = x + dist;
  child_cub[7] = y + dist;
  child_cub[8] = z;
  child_cub[9] = x;
  child_cub[10] = y + dist;
  child_cub[0xb] = z;
  child_cub[0xc] = x;
  child_cub[0xd] = y;
  child_cub[0xe] = z + dist;
  child_cub[0xf] = x + dist;
  child_cub[0x10] = y;
  child_cub[0x11] = z + dist;
  child_cub[0x12] = x + dist;
  child_cub[0x13] = y + dist;
  child_cub[0x14] = z + dist;
  child_cub[0x15] = x;
  child_cub[0x16] = y + dist;
  child_cub[0x17] = z + dist;
  for (local_34 = 0; local_34 < 0x18; local_34 = local_34 + 1) {
    if (1.0 < child_cub[local_34]) {
      child_cub[local_34] = 1.0;
    }
  }
  return;
}

Assistant:

void child_setup(double *child_cub,double x,double y,double z,double dist)
{
	child_cub[0]=x;				child_cub[1]=y;				child_cub[2]=z;

	child_cub[3]=x+dist;		child_cub[4]=y;				child_cub[5]=z;

	child_cub[6]=x+dist;		child_cub[7]=y+dist;		child_cub[8]=z;

	child_cub[9]=x;				child_cub[10]=y+dist;		child_cub[11]=z;


	child_cub[12]=x;			child_cub[13]=y;			child_cub[14]=z+dist;

	child_cub[15]=x+dist;		child_cub[16]=y;			child_cub[17]=z+dist;

	child_cub[18]=x+dist;		child_cub[19]=y+dist;		child_cub[20]=z+dist;

	child_cub[21]=x;			child_cub[22]=y+dist;		child_cub[23]=z+dist;

	for (int i = 0; i < 24; i++)
	{
		if (child_cub[i]>1.0)	child_cub[i]=1.0;
	}

}